

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-group.c
# Opt level: O1

void monster_group_rouse(chunk_conflict *c,monster *mon)

{
  wchar_t wVar1;
  monster *pmVar2;
  loc grid;
  _Bool _Var3;
  wchar_t wVar4;
  uint32_t uVar5;
  mon_group_list_entry *pmVar6;
  
  pmVar6 = c->monster_groups[mon->group_info[0].index]->member_list;
  _Var3 = flag_has_dbg(mon->mflag,2,8,"mon->mflag","MFLAG_AWARE");
  if (_Var3) {
    for (; pmVar6 != (mon_group_list_entry *)0x0; pmVar6 = pmVar6->next) {
      pmVar2 = c->monsters;
      wVar1 = pmVar6->midx;
      if (pmVar2[wVar1].m_timed[0] != 0) {
        grid.x = pmVar2[wVar1].grid.x;
        grid.y = pmVar2[wVar1].grid.y;
        _Var3 = monster_can_see((chunk *)c,(monster_conflict *)mon,grid);
        if (_Var3) {
          wVar4 = distance(mon->grid,(loc_conflict)grid);
          uVar5 = Rand_div(wVar4 * 0x14);
          if (uVar5 == 0) {
            monster_wake((monster_conflict *)(pmVar2 + wVar1),true,L'2');
          }
        }
      }
    }
  }
  return;
}

Assistant:

void monster_group_rouse(struct chunk *c, struct monster *mon)
{
	int index = mon->group_info[PRIMARY_GROUP].index;
	struct monster_group *group = c->monster_groups[index];
	struct mon_group_list_entry *entry = group->member_list;

	/* Not aware means don't rouse */
	if (!mflag_has(mon->mflag, MFLAG_AWARE)) return;

	while (entry) {
		struct monster *friend = &c->monsters[entry->midx];
		struct loc fgrid = friend->grid;
		if (friend->m_timed[MON_TMD_SLEEP] && monster_can_see(c, mon, fgrid)) {
			int dist = distance(mon->grid, fgrid);

			/* Closer means more likely to be roused */
			if (one_in_(dist * 20)) {
				monster_wake(friend, true, 50);
			}
		}
		entry = entry->next;
	}
}